

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O3

int CVodeSetJacTimes(void *cvode_mem,CVLsJacTimesSetupFn jtsetup,CVLsJacTimesVecFn jtimes)

{
  int iVar1;
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  CVodeMem local_28;
  CVLsMem local_20;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeSetJacTimes",&local_28,&local_20);
  if (iVar1 == 0) {
    if (local_20->LS->ops->setatimes == (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0
       ) {
      iVar1 = -3;
      cvProcessError(local_28,-3,0x247,"CVodeSetJacTimes",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                     ,"SUNLinearSolver object does not support user-supplied ATimes routine");
    }
    else {
      if (jtimes == (CVLsJacTimesVecFn)0x0) {
        local_20->jtimesDQ = 1;
        local_20->jtsetup = (CVLsJacTimesSetupFn)0x0;
        local_20->jtimes = cvLsDQJtimes;
        local_20->jt_f = local_28->cv_f;
      }
      else {
        local_20->jtimesDQ = 0;
        local_20->jtsetup = jtsetup;
        local_20->jtimes = jtimes;
        local_28 = (CVodeMem)local_28->cv_user_data;
      }
      local_20->jt_data = local_28;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int CVodeSetJacTimes(void* cvode_mem, CVLsJacTimesSetupFn jtsetup,
                     CVLsJacTimesVecFn jtimes)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* issue error if LS object does not allow user-supplied ATimes */
  if (cvls_mem->LS->ops->setatimes == NULL)
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__,
                   __FILE__, "SUNLinearSolver object does not support user-supplied ATimes routine");
    return (CVLS_ILL_INPUT);
  }

  /* store function pointers for user-supplied routines in CVLs
     interface (NULL jtimes implies use of DQ default) */
  if (jtimes != NULL)
  {
    cvls_mem->jtimesDQ = SUNFALSE;
    cvls_mem->jtsetup  = jtsetup;
    cvls_mem->jtimes   = jtimes;
    cvls_mem->jt_data  = cv_mem->cv_user_data;
  }
  else
  {
    cvls_mem->jtimesDQ = SUNTRUE;
    cvls_mem->jtsetup  = NULL;
    cvls_mem->jtimes   = cvLsDQJtimes;
    cvls_mem->jt_f     = cv_mem->cv_f;
    cvls_mem->jt_data  = cv_mem;
  }

  return (CVLS_SUCCESS);
}